

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  ulong uVar5;
  ImGuiWindow **ppIVar6;
  ImGuiWindow **ppIVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar5 = (ulong)uVar1;
  if (uVar5 != 0) {
    uVar4 = 0;
    if (0 < (int)uVar1 && ref_window != (ImGuiWindow *)0x0) {
      pIVar2 = (GImGui->OpenPopupStack).Data;
      ppIVar7 = &pIVar2->Window;
      uVar8 = 1;
      uVar4 = 0;
      do {
        pIVar3 = pIVar2[uVar4].Window;
        if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar3->Flags & 0x1000000) == 0)) {
          bVar9 = false;
          ppIVar6 = ppIVar7;
          uVar10 = uVar8;
          do {
            if ((*ppIVar6 == (ImGuiWindow *)0x0) ||
               ((*ppIVar6)->RootWindow != ref_window->RootWindow)) {
              bVar11 = true;
            }
            else {
              bVar9 = true;
              bVar11 = false;
            }
            if (!bVar11) break;
            ppIVar6 = ppIVar6 + 6;
            bVar11 = uVar10 < uVar5;
            uVar10 = uVar10 + 1;
          } while (bVar11);
          if (!bVar9) goto LAB_0012cf2e;
        }
        uVar4 = uVar4 + 1;
        ppIVar7 = ppIVar7 + 6;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar5);
      uVar4 = (ulong)uVar1;
    }
LAB_0012cf2e:
    if ((int)uVar4 < (int)uVar1) {
      ClosePopupToLevel((int)uVar4,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}